

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O3

void __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::~Tokenizer
          (Tokenizer<mecab_node_t,_mecab_path_t> *this)

{
  ~Tokenizer(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Tokenizer() { this->close(); }